

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int lua_resume(lua_State *L,lua_State *from,int nargs)

{
  unsigned_short uVar1;
  ushort uVar2;
  int errcode;
  TString *pTVar3;
  char *str;
  TValue *io;
  StkId pTVar4;
  StkId pTVar5;
  CallInfo *pCVar6;
  long lVar7;
  int status;
  int local_38;
  int local_34;
  
  uVar1 = L->nny;
  local_34 = nargs;
  if (L->status != '\x01') {
    if (L->status != '\0') {
      pTVar5 = L->top;
      lVar7 = (long)nargs * 0x10;
      pTVar4 = pTVar5 + -(long)nargs;
      L->top = pTVar4;
      str = "cannot resume dead coroutine";
      goto LAB_0010c8ad;
    }
    if (L->ci != &L->base_ci) {
      pTVar5 = L->top;
      lVar7 = (long)nargs * 0x10;
      pTVar4 = pTVar5 + -(long)nargs;
      L->top = pTVar4;
      str = "cannot resume non-suspended coroutine";
      goto LAB_0010c8ad;
    }
  }
  if (from == (lua_State *)0x0) {
    uVar2 = 1;
  }
  else {
    uVar2 = from->nCcalls + 1;
  }
  L->nCcalls = uVar2;
  if (uVar2 < 200) {
    L->nny = 0;
    errcode = luaD_rawrunprotected(L,resume,&local_34);
    if (errcode == -1) {
      local_38 = 2;
    }
    else {
      while (local_38 = errcode, 1 < errcode) {
        for (pCVar6 = L->ci; pCVar6 != (CallInfo *)0x0; pCVar6 = pCVar6->previous) {
          if ((pCVar6->callstatus & 0x10) != 0) goto LAB_0010c928;
        }
        pCVar6 = (CallInfo *)0x0;
LAB_0010c928:
        if (pCVar6 == (CallInfo *)0x0) break;
        pTVar5 = (StkId)((long)&L->stack->value_ + pCVar6->extra);
        luaF_close(L,pTVar5);
        seterrorobj(L,errcode,pTVar5);
        L->ci = pCVar6;
        L->allowhook = (byte)pCVar6->callstatus & 1;
        L->nny = 0;
        luaD_shrinkstack(L);
        L->errfunc = (ptrdiff_t)(pCVar6->u).l.savedpc;
        errcode = luaD_rawrunprotected(L,unroll,&local_38);
      }
      if (1 < errcode) {
        L->status = (lu_byte)errcode;
        seterrorobj(L,errcode,L->top);
        L->ci->top = L->top;
      }
    }
    L->nny = uVar1;
    L->nCcalls = L->nCcalls - 1;
    return local_38;
  }
  pTVar5 = L->top;
  lVar7 = (long)nargs * 0x10;
  pTVar4 = pTVar5 + -(long)nargs;
  L->top = pTVar4;
  str = "C stack overflow";
LAB_0010c8ad:
  pTVar3 = luaS_new(L,str);
  (pTVar4->value_).gc = (GCObject *)pTVar3;
  *(uint *)((long)pTVar5 + (8 - lVar7)) = pTVar3->tt | 0x40;
  L->top = L->top + 1;
  return 2;
}

Assistant:

LUA_API int lua_resume(lua_State *L, lua_State *from, int nargs) {
    int status;
    unsigned short oldnny = L->nny;  /* save "number of non-yieldable" calls */
    lua_lock(L);
    if (L->status == LUA_OK) {  /* may be starting a coroutine */
        if (L->ci != &L->base_ci)  /* not in base level? */
            return resume_error(L, "cannot resume non-suspended coroutine", nargs);
    } else if (L->status != LUA_YIELD)
        return resume_error(L, "cannot resume dead coroutine", nargs);
    L->nCcalls = (from) ? from->nCcalls + 1 : 1;
    if (L->nCcalls >= LUAI_MAXCCALLS)
        return resume_error(L, "C stack overflow", nargs);
    luai_userstateresume(L, nargs);
    L->nny = 0;  /* allow yields */
    api_checknelems(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
    status = luaD_rawrunprotected(L, resume, &nargs);
    if (status == -1)  /* error calling 'lua_resume'? */
        status = LUA_ERRRUN;
    else {  /* continue running after recoverable errors */
        while (errorstatus(status) && recover(L, status)) {
            /* unroll continuation */
            status = luaD_rawrunprotected(L, unroll, &status);
        }
        if (errorstatus(status)) {  /* unrecoverable error? */
            L->status = cast_byte(status);  /* mark thread as 'dead' */
            seterrorobj(L, status, L->top);  /* push error message */
            L->ci->top = L->top;
        } else
            lua_assert(status == L->status);  /* normal end or yield */
    }
    L->nny = oldnny;  /* restore 'nny' */
    L->nCcalls--;
    lua_assert(L->nCcalls == ((from) ? from->nCcalls : 0));
    lua_unlock(L);
    return status;
}